

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

SIMPLE_MOTION_DATA_TREE * setup_sms_tree(AV1_COMP *cpi,SIMPLE_MOTION_DATA_TREE *sms_tree)

{
  int stat_generation_stage_00;
  uint is_sb_size_128_00;
  int iVar1;
  BLOCK_SIZE *in_RSI;
  AV1_COMP *in_RDI;
  SIMPLE_MOTION_DATA_TREE *tree_2;
  int j;
  SIMPLE_MOTION_DATA_TREE *tree_1;
  int i;
  SIMPLE_MOTION_DATA_TREE *tree;
  int leaf_nodes;
  int leaf_factor;
  int nodes;
  int square_index;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int sms_tree_index;
  int tree_nodes;
  int is_sb_size_128;
  int stat_generation_stage;
  AV1_COMMON *cm;
  int local_5c;
  int local_4c;
  int local_38;
  int local_34;
  BLOCK_SIZE *local_30;
  int local_28;
  
  stat_generation_stage_00 = is_stat_generation_stage(in_RDI);
  is_sb_size_128_00 = (uint)(((in_RDI->common).seq_params)->sb_size == BLOCK_128X128);
  iVar1 = av1_get_pc_tree_nodes(is_sb_size_128_00,stat_generation_stage_00);
  local_34 = 1;
  if (stat_generation_stage_00 == 0) {
    local_38 = 1;
    if (is_sb_size_128_00 != 0) {
      local_38 = 4;
    }
    local_38 = local_38 << 8;
    for (local_28 = 0; local_30 = in_RSI, local_28 < local_38; local_28 = local_28 + 1) {
      in_RSI[(long)local_28 * 0x78] = BLOCK_4X4;
    }
    while (local_38 = local_38 >> 2, local_38 != 0) {
      for (local_4c = 0; local_4c < local_38; local_4c = local_4c + 1) {
        in_RSI[(long)local_28 * 0x78] = square[local_34];
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          *(BLOCK_SIZE **)(in_RSI + (long)local_28 * 0x78 + (long)local_5c * 8 + 8) = local_30;
          local_30 = local_30 + 0x78;
        }
        local_28 = local_28 + 1;
      }
      local_34 = local_34 + 1;
    }
  }
  else {
    *in_RSI = BLOCK_16X16;
  }
  return (SIMPLE_MOTION_DATA_TREE *)(in_RSI + (long)(iVar1 + -1) * 0x78);
}

Assistant:

static SIMPLE_MOTION_DATA_TREE *setup_sms_tree(
    AV1_COMP *const cpi, SIMPLE_MOTION_DATA_TREE *sms_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;
  this_sms = &sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  return &sms_tree[tree_nodes - 1];
}